

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insertproxymodel.cpp
# Opt level: O0

ItemFlags __thiscall InsertProxyModel::flags(InsertProxyModel *this,QModelIndex *index)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Int IVar4;
  long lVar5;
  long *plVar6;
  long *plVar7;
  bool local_c1;
  bool local_b1;
  QModelIndex local_a8;
  undefined1 local_90 [24];
  QFlags<Qt::ItemFlag> local_78;
  QFlags<Qt::ItemFlag> local_74;
  QFlags<Qt::ItemFlag> local_70;
  Int local_6c;
  QModelIndex local_68;
  bool local_4d;
  Int local_4c;
  undefined1 local_48 [3];
  bool isExtraCol;
  bool local_29;
  InsertProxyModelPrivate *pIStack_28;
  bool isExtraRow;
  InsertProxyModelPrivate *d;
  QModelIndex *index_local;
  InsertProxyModel *this_local;
  
  d = (InsertProxyModelPrivate *)index;
  index_local = (QModelIndex *)this;
  bVar1 = QModelIndex::isValid(index);
  if (bVar1) {
    lVar5 = QAbstractProxyModel::sourceModel();
    if (lVar5 == 0) {
      QFlags<Qt::ItemFlag>::QFlags((QFlags<Qt::ItemFlag> *)((long)&this_local + 4),NoItemFlags);
    }
    else {
      pIStack_28 = d_func(this);
      iVar2 = QModelIndex::row((QModelIndex *)d);
      plVar6 = (long *)QAbstractProxyModel::sourceModel();
      QModelIndex::QModelIndex((QModelIndex *)local_48);
      iVar3 = (**(code **)(*plVar6 + 0x78))(plVar6,local_48);
      local_b1 = false;
      if (iVar2 == iVar3) {
        local_4c = (Int)QFlags<InsertProxyModel::InsertDirection>::operator&
                                  (&pIStack_28->m_insertDirection,InsertRow);
        IVar4 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_4c);
        local_b1 = IVar4 != 0;
      }
      local_29 = local_b1;
      iVar2 = QModelIndex::column((QModelIndex *)d);
      plVar6 = (long *)QAbstractProxyModel::sourceModel();
      QModelIndex::QModelIndex(&local_68);
      iVar3 = (**(code **)(*plVar6 + 0x80))();
      local_c1 = false;
      if (iVar2 == iVar3) {
        local_6c = (Int)QFlags<InsertProxyModel::InsertDirection>::operator&
                                  (&pIStack_28->m_insertDirection,InsertColumn);
        IVar4 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_6c);
        local_c1 = IVar4 != 0;
      }
      local_4d = local_c1;
      if (((local_29 & 1U) == 0) || (local_c1 == false)) {
        if ((local_29 & 1U) == 0) {
          if (local_c1 == false) {
            plVar6 = (long *)QAbstractProxyModel::sourceModel();
            plVar7 = (long *)QAbstractProxyModel::sourceModel();
            iVar2 = QModelIndex::row((QModelIndex *)d);
            iVar3 = QModelIndex::column((QModelIndex *)d);
            QModelIndex::QModelIndex(&local_a8);
            (**(code **)(*plVar7 + 0x60))(local_90,plVar7,iVar2,iVar3,&local_a8);
            local_78.i = (**(code **)(*plVar6 + 0x138))(plVar6,local_90);
            this_local._4_4_ = QFlags<Qt::ItemFlag>::operator|(&local_78,ItemNeverHasChildren);
          }
          else {
            iVar2 = QModelIndex::row((QModelIndex *)d);
            local_74.i = (**(code **)(*(long *)this + 0x1d0))(this,0,iVar2);
            this_local._4_4_ = QFlags<Qt::ItemFlag>::operator|(&local_74,ItemNeverHasChildren);
          }
        }
        else {
          iVar2 = QModelIndex::column((QModelIndex *)d);
          local_70.i = (**(code **)(*(long *)this + 0x1d0))(this,1,iVar2);
          this_local._4_4_ = QFlags<Qt::ItemFlag>::operator|(&local_70,ItemNeverHasChildren);
        }
      }
      else {
        QFlags<Qt::ItemFlag>::QFlags((QFlags<Qt::ItemFlag> *)((long)&this_local + 4),NoItemFlags);
      }
    }
  }
  else {
    QFlags<Qt::ItemFlag>::QFlags((QFlags<Qt::ItemFlag> *)((long)&this_local + 4),NoItemFlags);
  }
  return (ItemFlags)this_local._4_4_;
}

Assistant:

Qt::ItemFlags InsertProxyModel::flags(const QModelIndex &index) const
{
    if (!index.isValid())
        return Qt::NoItemFlags;
    if (!sourceModel())
        return Qt::NoItemFlags;
    Q_D(const InsertProxyModel);
    const bool isExtraRow = index.row() == sourceModel()->rowCount() && d->m_insertDirection & InsertRow;
    const bool isExtraCol = index.column() == sourceModel()->columnCount() && d->m_insertDirection & InsertColumn;
    if (isExtraRow && isExtraCol)
        return Qt::NoItemFlags;
    if (isExtraRow)
        return flagForExtra(true, index.column()) | Qt::ItemNeverHasChildren;
    if (isExtraCol)
        return flagForExtra(false, index.row()) | Qt::ItemNeverHasChildren;
    return sourceModel()->flags(sourceModel()->index(index.row(), index.column())) | Qt::ItemNeverHasChildren;
}